

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void __thiscall Assimp::MD5::MD5Parser::ParseHeader(MD5Parser *this)

{
  char **out;
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  Logger *this_00;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  long *local_50 [2];
  long local_40 [2];
  
  out = &this->buffer;
  for (pcVar6 = this->buffer; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
  }
  *out = pcVar6;
  iVar4 = strncmp("MD5Version",pcVar6,10);
  if (iVar4 == 0) {
    bVar2 = pcVar6[10];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      pcVar7 = pcVar6 + 0xb;
      if (bVar2 == 0) {
        pcVar7 = pcVar6 + 10;
      }
      *out = pcVar7;
      for (; (*pcVar7 == ' ' || (*pcVar7 == '\t')); pcVar7 = pcVar7 + 1) {
      }
      *out = pcVar7;
      cVar3 = *pcVar7;
      if ((byte)(cVar3 - 0x3aU) < 0xf6) {
        *out = pcVar7;
      }
      else {
        iVar4 = 0;
        do {
          iVar4 = (uint)(byte)(cVar3 - 0x30) + iVar4 * 10;
          cVar3 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        } while (0xf5 < (byte)(cVar3 - 0x3aU));
        *out = pcVar7;
        if (iVar4 == 10) {
          SkipLine(this);
          pcVar7 = this->buffer;
          pcVar6 = pcVar7 + 1;
          do {
            do {
              *out = pcVar6;
              pbVar1 = (byte *)(pcVar6 + -1);
              pcVar6 = pcVar6 + 1;
            } while (0xd < *pbVar1);
          } while ((0x3401U >> (*pbVar1 & 0x1f) & 1) == 0);
          this_00 = DefaultLogger::get();
          uVar5 = (long)*out - (long)pcVar7;
          if (0x3ff < uVar5) {
            uVar5 = 0x400;
          }
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar7,pcVar7 + uVar5);
          Logger::info(this_00,(char *)local_50[0]);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          SkipSpacesAndLineEnd(this,this->buffer,out);
          return;
        }
      }
      ReportError("MD5 version tag is unknown (10 is expected)",this->lineNumber);
    }
  }
  ReportError("Invalid MD5 file: MD5Version tag has not been found",this->lineNumber);
}

Assistant:

void MD5Parser::ParseHeader()
{
    // parse and validate the file version
    SkipSpaces();
    if (!TokenMatch(buffer,"MD5Version",10))    {
        ReportError("Invalid MD5 file: MD5Version tag has not been found");
    }
    SkipSpaces();
    unsigned int iVer = ::strtoul10(buffer,(const char**)&buffer);
    if (10 != iVer) {
        ReportError("MD5 version tag is unknown (10 is expected)");
    }
    SkipLine();

    // print the command line options to the console
    // FIX: can break the log length limit, so we need to be careful
    char* sz = buffer;
    while (!IsLineEnd( *buffer++));
    ASSIMP_LOG_INFO(std::string(sz,std::min((uintptr_t)MAX_LOG_MESSAGE_LENGTH, (uintptr_t)(buffer-sz))));
    SkipSpacesAndLineEnd();
}